

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.h
# Opt level: O3

void TypeCheck_AndOperator(KonohaContext *kctx,KonohaStack *sfp)

{
  kNameSpace *node;
  KClass *pKVar1;
  kNameSpace *pkVar2;
  kNameSpace *ns;
  
  node = (kNameSpace *)sfp[1].field_0.asNode;
  pKVar1 = *(KClass **)((kctx->share->classTable).field_1.bytebuf + 0x58);
  pkVar2 = node;
  do {
    ns = ((anon_union_8_4_b004c7c0_for_kNodeVar_7 *)&pkVar2->importedNameSpaceList)->StmtNameSpace;
    if ((((anon_union_8_4_b004c7c0_for_kNodeVar_7 *)&pkVar2->importedNameSpaceList)->StmtNameSpace->
        h).ct == pKVar1) break;
    pkVar2 = ((anon_union_8_2_7d56b7f0_for_kNodeVar_3 *)&pkVar2->packageId)->RootNodeNameSpace;
    ns = pkVar2;
  } while ((pkVar2->h).ct != pKVar1);
  (*(kctx->platApi->ConsoleModule).ReportDebugMessage)
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"TypeCheck_AndOperator",0x1a1,"tracing..");
  pkVar2 = (kNameSpace *)
           TypeCheckNodeAt(kctx,(kNode *)node,1,ns,
                           *(KClass **)((kctx->share->classTable).field_1.bytebuf + 0x18),0);
  if (((*(int *)&pkVar2->parentNULL != 0x18) &&
      (pkVar2 = (kNameSpace *)
                TypeCheckNodeAt(kctx,(kNode *)node,2,ns,
                                *(KClass **)((kctx->share->classTable).field_1.bytebuf + 0x18),0),
      *(int *)&pkVar2->parentNULL != 0x18)) && (pkVar2 = node, *(int *)&node->parentNULL != 0x18)) {
    node->parentNULL = (kNameSpace *)0x30000000a;
  }
  sfp[-4].field_0.asNode = (kNode *)pkVar2;
  (*kctx->klib->CheckSafePoint)(kctx,sfp,0);
  return;
}

Assistant:

static KMETHOD TypeCheck_AndOperator(KonohaContext *kctx, KonohaStack *sfp)
{
	VAR_TypeCheck2(stmt, expr, ns, reqc);
	kNode *returnNode = TypeCheckNodeAt(kctx, expr, 1, ns, KClass_Boolean, 0);
	if(!kNode_IsError(returnNode)) {
		returnNode = TypeCheckNodeAt(kctx, expr, 2, ns, KClass_Boolean, 0);
		if(!kNode_IsError(returnNode)) {
			returnNode = kNode_Type(expr, KNode_And, KType_Boolean);
		}
	}
	KReturn(returnNode);
}